

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Break * __thiscall
wasm::Builder::makeBreak(Builder *this,Name name,Expression *value,Expression *condition)

{
  Break *pBVar1;
  
  pBVar1 = MixedArena::alloc<wasm::Break>(&this->wasm->allocator);
  (pBVar1->name).super_IString.str._M_len = name.super_IString.str._M_len;
  (pBVar1->name).super_IString.str._M_str = name.super_IString.str._M_str;
  pBVar1->value = value;
  pBVar1->condition = condition;
  wasm::Break::finalize();
  return pBVar1;
}

Assistant:

Break* makeBreak(Name name,
                   Expression* value = nullptr,
                   Expression* condition = nullptr) {
    auto* ret = wasm.allocator.alloc<Break>();
    ret->name = name;
    ret->value = value;
    ret->condition = condition;
    ret->finalize();
    return ret;
  }